

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> * __thiscall
pybind11::class_<kratos::Port,std::shared_ptr<kratos::Port>,kratos::Var>::
def_property<kratos::PortDirection(kratos::Port::*)()const>
          (class_<kratos::Port,std::shared_ptr<kratos::Port>,kratos::Var> *this,char *name,
          offset_in_Var_to_subr *fget,cpp_function *fset)

{
  class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> *pcVar1;
  return_value_policy local_51;
  offset_in_Var_to_subr local_50;
  void *local_40;
  offset_in_Var_to_subr local_38;
  cpp_function local_30;
  cpp_function *local_28;
  cpp_function *fset_local;
  offset_in_Var_to_subr *fget_local;
  char *name_local;
  class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> *this_local;
  
  local_40 = (void *)*fget;
  local_38 = fget[1];
  local_28 = fset;
  fset_local = (cpp_function *)fget;
  fget_local = (offset_in_Var_to_subr *)name;
  name_local = (char *)this;
  local_50 = _kratos__Port___pybind11__method_adaptor<kratos::Port,kratos::PortDirection,kratos::Port>_kratos__PortDirection_kratos__Port______const__
                       (local_40,local_38);
  cpp_function::cpp_function<kratos::PortDirection,kratos::Port>(&local_30,local_50);
  local_51 = reference_internal;
  pcVar1 = class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var>::
           def_property<pybind11::return_value_policy>
                     ((class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> *)this,name,
                      &local_30,local_28,&local_51);
  cpp_function::~cpp_function(&local_30);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(method_adaptor<type>(fget)), fset,
                            return_value_policy::reference_internal, extra...);
    }